

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint preProcessScanlines(uchar **out,size_t *outsize,uchar *in,uint w,uint h,LodePNGInfo *info_png,
                        LodePNGEncoderSettings *settings)

{
  LodePNGColorMode *info;
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  uint uVar7;
  uint extraout_EAX;
  uchar *puVar8;
  void *__ptr;
  long lVar9;
  ulong uVar10;
  uchar **extraout_RAX;
  uchar *out_00;
  size_t bytewidth;
  uint uVar11;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  byte bVar17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  ulong local_280;
  ulong local_250;
  uint passh [7];
  uint passw [7];
  uint passh_1 [7];
  uint passw_1 [7];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t local_138 [8];
  size_t passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  int iVar12;
  
  uVar14 = (ulong)(info_png->color).colortype;
  iVar12 = 0;
  if (uVar14 < 7) {
    iVar12 = *(int *)(&DAT_001231d4 + uVar14 * 4);
  }
  uVar11 = iVar12 * (info_png->color).bitdepth;
  info = &info_png->color;
  if (info_png->interlace_method == 0) {
    uVar7 = uVar11 * w;
    uVar19 = (uVar7 + 7 >> 3) * h;
    uVar14 = (ulong)(uVar19 + h);
    *outsize = uVar14;
    puVar8 = (uchar *)malloc(uVar14);
    *out = puVar8;
    if ((puVar8 != (uchar *)0x0) || (*outsize == 0)) {
      if ((uVar11 < 8) && (uVar11 = uVar7 + 7 & 0xfffffff8, uVar7 != uVar11)) {
        out_00 = (uchar *)malloc((ulong)uVar19);
        if (out_00 != (uchar *)0x0) {
          addPaddingBits(out_00,in,(ulong)uVar11,(ulong)uVar7,h);
          filter(puVar8,out_00,w,h,info,settings);
        }
        free(out_00);
        return extraout_EAX;
      }
      uVar11 = filter(puVar8,in,w,h,info,settings);
      return uVar11;
    }
  }
  else {
    Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,passstart,w,h,uVar11);
    *outsize = filter_passstart[7];
    puVar8 = (uchar *)malloc(filter_passstart[7]);
    *out = puVar8;
    __ptr = malloc(passstart[7]);
    if ((puVar8 != (uchar *)0x0) && (passstart[7] == 0 || __ptr != (void *)0x0)) {
      Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,local_138,w,h,uVar11
                         );
      if (uVar11 < 8) {
        lVar9 = 0;
        do {
          uVar7 = passh_1[lVar9];
          if (uVar7 != 0) {
            uVar19 = passw_1[lVar9];
            uVar18 = 0;
            do {
              if ((ulong)uVar19 != 0) {
                uVar2 = ADAM7_DY[lVar9];
                uVar3 = ADAM7_IY[lVar9];
                uVar4 = ADAM7_DX[lVar9];
                sVar6 = local_138[lVar9];
                uVar5 = ADAM7_IX[lVar9];
                uVar14 = 0;
                do {
                  if (uVar11 != 0) {
                    uVar13 = (ulong)((uVar19 * uVar18 + (int)uVar14) * uVar11) + sVar6 * 8;
                    uVar10 = (ulong)((uVar4 * (int)uVar14 + (uVar2 * uVar18 + uVar3) * w + uVar5) *
                                    uVar11);
                    uVar15 = uVar11;
                    do {
                      bVar17 = '\x01' << (~(byte)uVar13 & 7);
                      if ((in[uVar10 >> 3] >> (~(byte)uVar10 & 7) & 1) == 0) {
                        pbVar1 = (byte *)((long)__ptr + (uVar13 >> 3));
                        *pbVar1 = *pbVar1 & ~bVar17;
                      }
                      else {
                        pbVar1 = (byte *)((long)__ptr + (uVar13 >> 3));
                        *pbVar1 = *pbVar1 | bVar17;
                      }
                      uVar13 = uVar13 + 1;
                      uVar10 = uVar10 + 1;
                      uVar15 = uVar15 - 1;
                    } while (uVar15 != 0);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar19);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar7);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 7);
      }
      else {
        uVar14 = (ulong)(uVar11 >> 3);
        lVar9 = 0;
        do {
          uVar7 = passh_1[lVar9];
          if ((ulong)uVar7 != 0) {
            uVar10 = (ulong)passw_1[lVar9];
            local_250 = 0;
            local_280 = 0;
            do {
              if (uVar10 != 0) {
                uVar19 = ADAM7_DX[lVar9];
                sVar6 = local_138[lVar9];
                uVar18 = (ADAM7_DY[lVar9] * (int)local_280 + ADAM7_IY[lVar9]) * w + ADAM7_IX[lVar9];
                uVar13 = uVar10;
                uVar16 = local_250;
                do {
                  memcpy((void *)((long)__ptr + (uVar16 & 0xffffffff) * uVar14 + sVar6),
                         in + uVar18 * uVar14,uVar14);
                  uVar18 = uVar18 + uVar19;
                  uVar16 = uVar16 + 1;
                  uVar13 = uVar13 - 1;
                } while (uVar13 != 0);
              }
              local_280 = local_280 + 1;
              local_250 = local_250 + uVar10;
            } while (local_280 != uVar7);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 7);
      }
      lVar9 = 0;
      do {
        if (uVar11 < 8) {
          puVar8 = (uchar *)malloc(*(long *)((long)padded_passstart + lVar9 * 2 + 8) -
                                   *(long *)((long)padded_passstart + lVar9 * 2));
          if (puVar8 == (uchar *)0x0) break;
          uVar7 = *(uint *)((long)passw + lVar9);
          uVar18 = uVar7 * uVar11;
          uVar19 = *(uint *)((long)passh + lVar9);
          addPaddingBits(puVar8,(uchar *)(*(long *)((long)passstart + lVar9 * 2) + (long)__ptr),
                         (ulong)(uVar18 + 7 & 0xfffffff8),(ulong)uVar18,uVar19);
          uVar7 = filter(*out + *(long *)((long)filter_passstart + lVar9 * 2),puVar8,uVar7,uVar19,
                         info,settings);
          free(puVar8);
        }
        else {
          uVar7 = filter(*out + *(long *)((long)filter_passstart + lVar9 * 2),
                         (uchar *)(*(long *)((long)padded_passstart + lVar9 * 2) + (long)__ptr),
                         *(uint *)((long)passw + lVar9),*(uint *)((long)passh + lVar9),info,settings
                        );
        }
        if ((uVar7 != 0) || (bVar20 = lVar9 == 0x18, lVar9 = lVar9 + 4, bVar20)) break;
      } while( true );
    }
    free(__ptr);
    out = extraout_RAX;
  }
  return (uint)out;
}

Assistant:

static unsigned preProcessScanlines(unsigned char** out, size_t* outsize, const unsigned char* in,
	unsigned w, unsigned h,
	const LodePNGInfo* info_png, const LodePNGEncoderSettings* settings)
{
	/*
	This function converts the pure 2D image with the PNG's colortype, into filtered-padded-interlaced data. Steps:
	*) if no Adam7: 1) add padding bits (= posible extra bits per scanline if bpp < 8) 2) filter
	*) if adam7: 1) Adam7_interlace 2) 7x add padding bits 3) 7x filter
	*/
	unsigned bpp = lodepng_get_bpp(&info_png->color);
	unsigned error = 0;

	if (info_png->interlace_method == 0)
	{
		*outsize = h + (h * ((w * bpp + 7) / 8)); /*image size plus an extra byte per scanline + possible padding bits*/
		*out = (unsigned char*)lodepng_malloc(*outsize);
		if (!(*out) && (*outsize)) error = 83; /*alloc fail*/

		if (!error)
		{
			/*non multiple of 8 bits per scanline, padding bits needed per scanline*/
			if (bpp < 8 && w * bpp != ((w * bpp + 7) / 8) * 8)
			{
				unsigned char* padded = (unsigned char*)lodepng_malloc(h * ((w * bpp + 7) / 8));
				if (!padded) error = 83; /*alloc fail*/
				if (!error)
				{
					addPaddingBits(padded, in, ((w * bpp + 7) / 8) * 8, w * bpp, h);
					error = filter(*out, padded, w, h, &info_png->color, settings);
				}
				lodepng_free(padded);
			}
			else
			{
				/*we can immediately filter into the out buffer, no other steps needed*/
				error = filter(*out, in, w, h, &info_png->color, settings);
			}
		}
	}
	else /*interlace_method is 1 (Adam7)*/
	{
		unsigned passw[7], passh[7];
		size_t filter_passstart[8], padded_passstart[8], passstart[8];
		unsigned char* adam7;

		Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

		*outsize = filter_passstart[7]; /*image size plus an extra byte per scanline + possible padding bits*/
		*out = (unsigned char*)lodepng_malloc(*outsize);
		if (!(*out)) error = 83; /*alloc fail*/

		adam7 = (unsigned char*)lodepng_malloc(passstart[7]);
		if (!adam7 && passstart[7]) error = 83; /*alloc fail*/

		if (!error)
		{
			unsigned i;

			Adam7_interlace(adam7, in, w, h, bpp);
			for (i = 0; i != 7; ++i)
			{
				if (bpp < 8)
				{
					unsigned char* padded = (unsigned char*)lodepng_malloc(padded_passstart[i + 1] - padded_passstart[i]);
					if (!padded) ERROR_BREAK(83); /*alloc fail*/
					addPaddingBits(padded, &adam7[passstart[i]],
						((passw[i] * bpp + 7) / 8) * 8, passw[i] * bpp, passh[i]);
					error = filter(&(*out)[filter_passstart[i]], padded,
						passw[i], passh[i], &info_png->color, settings);
					lodepng_free(padded);
				}
				else
				{
					error = filter(&(*out)[filter_passstart[i]], &adam7[padded_passstart[i]],
						passw[i], passh[i], &info_png->color, settings);
				}

				if (error) break;
			}
		}

		lodepng_free(adam7);
	}

	return error;
}